

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O1

void state_align_search_free(ps_search_t *search)

{
  ps_search_base_free(search);
  ckd_free(search[1].name);
  ckd_free(search[1].d2p);
  ckd_free(search[1].pls);
  ckd_free(search[1].config);
  hmm_context_free((hmm_context_t *)search[1].vt);
  ps_alignment_free((ps_alignment_t *)search[1].type);
  ckd_free(search);
  return;
}

Assistant:

static void
state_align_search_free(ps_search_t *search)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    ps_search_base_free(search);
    ckd_free(sas->hmms);
    ckd_free(sas->tokens);
    ckd_free(sas->sf);
    ckd_free(sas->ef);
    hmm_context_free(sas->hmmctx);
    ps_alignment_free(sas->al);
    ckd_free(sas);
}